

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_mutex-unix.c
# Opt level: O1

void global_os_mutex_unlock(void)

{
  int iVar1;
  
  if (global_os_mutex == (os_mutex *)0x0) {
    global_os_mutex_unlock_cold_1();
  }
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)global_os_mutex);
  if (iVar1 == 0) {
    return;
  }
  __cilkrts_os_mutex_unlock_cold_1();
}

Assistant:

void global_os_mutex_unlock(void)
{
    // We'd better have allocated a global_os_mutex.  This means you should
    // have called global_os_mutex_lock() before calling
    // global_os_mutex_unlock(), but this is the only check for it.
    CILK_ASSERT(NULL != global_os_mutex);

    // Release the global OS mutex
    __cilkrts_os_mutex_unlock(global_os_mutex);
}